

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_solveRealLPAndRecordStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,bool *interrupt)

{
  type_conflict5 tVar1;
  int iVar2;
  int iVar3;
  Representation RVar4;
  Type TVar5;
  element_type *peVar6;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar7;
  Real RVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  Verbosity old_verbosity_1;
  SPxException *E;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mintol;
  bool _hadBasis;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined1 in_stack_00001f9f;
  bool *in_stack_00001fa0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00001fa8;
  undefined4 in_stack_fffffffffffffb78;
  Representation in_stack_fffffffffffffb7c;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  undefined4 in_stack_fffffffffffffb88;
  Type in_stack_fffffffffffffb8c;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb90;
  self_type *in_stack_fffffffffffffb98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffba0;
  Real local_2b0;
  undefined1 local_2a8 [56];
  Real local_270;
  undefined1 local_268 [56];
  Real local_230;
  undefined1 local_228 [56];
  Real local_1f0;
  undefined1 local_1e8 [88];
  Real local_190;
  Real local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_150;
  undefined8 local_118;
  undefined1 local_10c [59];
  byte local_d1;
  undefined8 local_c0;
  Real *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  Real *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  Real *local_88;
  undefined1 *local_80;
  undefined8 local_78;
  Real *local_70;
  undefined1 *local_68;
  Real *local_60;
  Real *local_58;
  Real *local_50;
  Real *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_d1 = in_RDI->_hasBasis & 1;
  iVar2 = intParam(in_RDI,ITERLIMIT);
  RVar7 = realParam(in_RDI,INFTY);
  if (RVar7 <= (double)iVar2) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationIter(&in_RDI->_solver,-1);
  }
  else {
    iVar2 = intParam(in_RDI,ITERLIMIT);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationIter(&in_RDI->_solver,iVar2 - in_RDI->_statistics->iterations);
  }
  RVar7 = realParam(in_RDI,TIMELIMIT);
  RVar8 = realParam(in_RDI,INFTY);
  if (RVar8 <= RVar7) {
    RVar7 = realParam(in_RDI,INFTY);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationTime(&in_RDI->_solver,RVar7);
  }
  else {
    RVar7 = realParam(in_RDI,TIMELIMIT);
    (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setTerminationTime(&in_RDI->_solver,RVar7 - extraout_XMM0_Qa);
  }
  local_118 = 0x40c3880000000000;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
  local_30 = &local_118;
  local_38 = &local_150;
  local_28 = local_10c;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,&local_150);
  local_20 = local_10c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  local_18 = local_38;
  local_8 = local_30;
  local_10 = local_10c;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),(double *)0x474187);
  tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4741b1);
  local_158 = Tolerances::floatingPointFeastol(peVar6);
  tVar1 = boost::multiprecision::operator<
                    ((double *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x4741eb);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x474201);
  if (tVar1) {
    tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x47423b);
    dVar9 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x474250);
    Tolerances::setFloatingPointFeastol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x474280);
  }
  tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4742f8);
  local_190 = Tolerances::floatingPointOpttol(peVar6);
  tVar1 = boost::multiprecision::operator<
                    ((double *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x474332);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x474348);
  if (tVar1) {
    tolerances((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x474382);
    dVar9 = boost::multiprecision::number::operator_cast_to_double
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x474397);
    Tolerances::setFloatingPointOpttol(peVar6,dVar9);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x4743c7);
  }
  iVar2 = intParam(in_RDI,REPRESENTATION);
  if (iVar2 == 1) {
LAB_004744be:
    RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::rep(&in_RDI->_solver);
    if (RVar4 == COLUMN) goto LAB_004744f5;
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setRep((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             in_stack_fffffffffffffb7c);
  }
  else {
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 0) {
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x47445f);
      RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4744a8);
      if ((double)(iVar3 + 1) <= (double)(iVar2 + 1) * RVar7) goto LAB_004744be;
    }
LAB_004744f5:
    iVar2 = intParam(in_RDI,REPRESENTATION);
    if (iVar2 == 2) {
LAB_00474598:
      RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rep(&in_RDI->_solver);
      if (RVar4 != ROW) {
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setRep((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb7c);
      }
    }
    else {
      iVar2 = intParam(in_RDI,REPRESENTATION);
      if (iVar2 == 0) {
        iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x47453f);
        RVar7 = realParam(in_RDI,REPRESENTATION_SWITCH);
        iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)0x474585);
        if ((double)(iVar2 + 1) * RVar7 < (double)(iVar3 + 1)) goto LAB_00474598;
      }
    }
  }
  iVar2 = intParam(in_RDI,ALGORITHM);
  if ((((iVar2 == 0) &&
       (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rep(&in_RDI->_solver), RVar4 == COLUMN)) ||
      ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 1 &&
       (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
     (TVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::type(&in_RDI->_solver), TVar5 != ENTER)) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setType(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
  }
  else {
    iVar2 = intParam(in_RDI,ALGORITHM);
    if ((((iVar2 == 1) &&
         (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rep(&in_RDI->_solver), RVar4 == COLUMN)) ||
        ((iVar2 = intParam(in_RDI,ALGORITHM), iVar2 == 0 &&
         (RVar4 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rep(&in_RDI->_solver), RVar4 == ROW)))) &&
       (TVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::type(&in_RDI->_solver), TVar5 != LEAVE)) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setType(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
    }
  }
  local_1f0 = realParam(in_RDI,SPARSITY_THRESHOLD);
  local_b0 = local_1e8;
  local_b8 = &local_1f0;
  local_c0 = 0;
  local_48 = local_b8;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb90,
             (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (type *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setSparsePricingFactor
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  iVar2 = intParam(in_RDI,HYPER_PRICING);
  if (iVar2 == 2) {
LAB_004747f4:
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::hyperPricing(in_stack_fffffffffffffb90,SUB41((uint)in_stack_fffffffffffffb8c >> 0x18,0));
  }
  else {
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 1) {
      iVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4747cd);
      iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x4747e5);
      if (5000 < iVar2 + iVar3) goto LAB_004747f4;
    }
    iVar2 = intParam(in_RDI,HYPER_PRICING);
    if (iVar2 == 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::hyperPricing(in_stack_fffffffffffffb90,SUB41((uint)in_stack_fffffffffffffb8c >> 0x18,0));
    }
  }
  local_230 = realParam(in_RDI,REFAC_BASIS_NNZ);
  local_98 = local_228;
  local_a0 = &local_230;
  local_a8 = 0;
  local_50 = local_a0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb90,
             (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (type *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setNonzeroFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_270 = realParam(in_RDI,REFAC_UPDATE_FILL);
  local_80 = local_268;
  local_88 = &local_270;
  local_90 = 0;
  local_58 = local_88;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb90,
             (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (type *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setFillFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  local_2b0 = realParam(in_RDI,REFAC_MEM_FACTOR);
  local_68 = local_2a8;
  local_70 = &local_2b0;
  local_78 = 0;
  local_60 = local_70;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffb90,
             (double)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (type *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMemFactor((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[3])();
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solve(in_stack_00001fa8,in_stack_00001fa0,(bool)in_stack_00001f9f);
  (*in_RDI->_statistics->simplexTime->_vptr_Timer[4])();
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x474cc1);
  if (0 < iVar2) {
    SLUFactorRational::clear
              ((SLUFactorRational *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  }
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x474cfc);
  in_RDI->_statistics->iterations = iVar2 + in_RDI->_statistics->iterations;
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::primalIterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  in_RDI->_statistics->iterationsPrimal = iVar2 + in_RDI->_statistics->iterationsPrimal;
  if ((local_d1 & 1) == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::iterations((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x474d5a);
  }
  in_RDI->_statistics->iterationsFromBasis = iVar2 + in_RDI->_statistics->iterationsFromBasis;
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::polishIterations(&in_RDI->_solver);
  in_RDI->_statistics->iterationsPolish = iVar3 + in_RDI->_statistics->iterationsPolish;
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::boundFlips(&in_RDI->_solver);
  in_RDI->_statistics->boundflips = iVar3 + in_RDI->_statistics->boundflips;
  (*((in_RDI->_solver).multTimeSparse)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeSparse = extraout_XMM0_Qa_00 + in_RDI->_statistics->multTimeSparse;
  (*((in_RDI->_solver).multTimeFull)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeFull = extraout_XMM0_Qa_01 + in_RDI->_statistics->multTimeFull;
  (*((in_RDI->_solver).multTimeColwise)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeColwise = extraout_XMM0_Qa_02 + in_RDI->_statistics->multTimeColwise;
  (*((in_RDI->_solver).multTimeUnsetup)->_vptr_Timer[6])();
  in_RDI->_statistics->multTimeUnsetup = extraout_XMM0_Qa_03 + in_RDI->_statistics->multTimeUnsetup;
  in_RDI->_statistics->multSparseCalls =
       (in_RDI->_solver).multSparseCalls + in_RDI->_statistics->multSparseCalls;
  in_RDI->_statistics->multFullCalls =
       (in_RDI->_solver).multFullCalls + in_RDI->_statistics->multFullCalls;
  in_RDI->_statistics->multColwiseCalls =
       (in_RDI->_solver).multColwiseCalls + in_RDI->_statistics->multColwiseCalls;
  in_RDI->_statistics->multUnsetupCalls =
       (in_RDI->_solver).multUnsetupCalls + in_RDI->_statistics->multUnsetupCalls;
  RVar7 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getFactorTime((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)0x474ec0);
  in_RDI->_statistics->luFactorizationTimeReal =
       RVar7 + in_RDI->_statistics->luFactorizationTimeReal;
  RVar7 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getSolveTime((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)0x474ee8);
  in_RDI->_statistics->luSolveTimeReal = RVar7 + in_RDI->_statistics->luSolveTimeReal;
  iVar3 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getFactorCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luFactorizationsReal = iVar3 + in_RDI->_statistics->luFactorizationsReal;
  iVar3 = SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getSolveCount(&in_RDI->_slufactor);
  in_RDI->_statistics->luSolvesReal = iVar3 + in_RDI->_statistics->luSolvesReal;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::resetCounters((SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)CONCAT44(iVar2,in_stack_fffffffffffffb80));
  iVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::primalDegeneratePivots
                    ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar2,in_stack_fffffffffffffb80));
  in_RDI->_statistics->degenPivotsPrimal = iVar3 + in_RDI->_statistics->degenPivotsPrimal;
  iVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::dualDegeneratePivots
                    ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(iVar2,in_stack_fffffffffffffb80));
  in_RDI->_statistics->degenPivotsDual = iVar2 + in_RDI->_statistics->degenPivotsDual;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::sumDualDegeneracy((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator+=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::sumPrimalDegeneracy
            ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  ::operator+=(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  return;
}

Assistant:

void SoPlexBase<R>::_solveRealLPAndRecordStatistics(volatile bool* interrupt)
{
   bool _hadBasis = _hasBasis;

   // set time and iteration limit
   if(intParam(SoPlexBase<R>::ITERLIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationIter(intParam(SoPlexBase<R>::ITERLIMIT) - _statistics->iterations);
   else
      _solver.setTerminationIter(-1);

   if(realParam(SoPlexBase<R>::TIMELIMIT) < realParam(SoPlexBase<R>::INFTY))
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::TIMELIMIT)) -
                                 _statistics->solvingTime->time());
   else
      _solver.setTerminationTime(Real(realParam(SoPlexBase<R>::INFTY)));

   // ensure that tolerances are not too small
   R mintol = 1e4 * _solver.epsilon();

   if(this->tolerances()->floatingPointFeastol() < mintol)
      this->tolerances()->setFloatingPointFeastol(Real(mintol));

   if(this->tolerances()->floatingPointOpttol() < mintol)
      this->tolerances()->setFloatingPointOpttol(Real(mintol));

   // set correct representation
   if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_COLUMN
         || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
             && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) >=
             (_solver.nRows() + 1)))
         && _solver.rep() != SPxSolverBase<R>::COLUMN)
   {
      _solver.setRep(SPxSolverBase<R>::COLUMN);
   }
   else if((intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_ROW
            || (intParam(SoPlexBase<R>::REPRESENTATION) == SoPlexBase<R>::REPRESENTATION_AUTO
                && (_solver.nCols() + 1) * realParam(SoPlexBase<R>::REPRESENTATION_SWITCH) < (_solver.nRows() + 1)))
           && _solver.rep() != SPxSolverBase<R>::ROW)
   {
      _solver.setRep(SPxSolverBase<R>::ROW);
   }

   // set correct type
   if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
         && _solver.rep() == SPxSolverBase<R>::COLUMN)
         || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL && _solver.rep() == SPxSolverBase<R>::ROW))
         && _solver.type() != SPxSolverBase<R>::ENTER)
   {
      _solver.setType(SPxSolverBase<R>::ENTER);
   }
   else if(((intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_DUAL
             && _solver.rep() == SPxSolverBase<R>::COLUMN)
            || (intParam(ALGORITHM) == SoPlexBase<R>::ALGORITHM_PRIMAL
                && _solver.rep() == SPxSolverBase<R>::ROW))
           && _solver.type() != SPxSolverBase<R>::LEAVE)
   {
      _solver.setType(SPxSolverBase<R>::LEAVE);
   }

   // set pricing modes
   _solver.setSparsePricingFactor(realParam(SoPlexBase<R>::SPARSITY_THRESHOLD));

   if((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_ON)
         || ((intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_AUTO)
             && (_solver.nRows() + _solver.nCols() > SOPLEX_HYPERPRICINGTHRESHOLD)))
      _solver.hyperPricing(true);
   else if(intParam(SoPlexBase<R>::HYPER_PRICING) == SoPlexBase<R>::HYPER_PRICING_OFF)
      _solver.hyperPricing(false);

   _solver.setNonzeroFactor(realParam(SoPlexBase<R>::REFAC_BASIS_NNZ));
   _solver.setFillFactor(realParam(SoPlexBase<R>::REFAC_UPDATE_FILL));
   _solver.setMemFactor(realParam(SoPlexBase<R>::REFAC_MEM_FACTOR));

   // call floating-point solver and catch exceptions
   _statistics->simplexTime->start();

   try
   {
      _solver.solve(interrupt);
   }
   catch(const SPxException& E)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() << "> while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Caught unknown exception while solving Real LP.\n");
      _status = SPxSolverBase<R>::ERROR;
   }

   _statistics->simplexTime->stop();

   // invalidate rational factorization of basis if pivots have been performed
   if(_solver.iterations() > 0)
      _rationalLUSolver.clear();

   // record statistics
   _statistics->iterations += _solver.iterations();
   _statistics->iterationsPrimal += _solver.primalIterations();
   _statistics->iterationsFromBasis += _hadBasis ? _solver.iterations() : 0;
   _statistics->iterationsPolish += _solver.polishIterations();
   _statistics->boundflips += _solver.boundFlips();
   _statistics->multTimeSparse += _solver.multTimeSparse->time();
   _statistics->multTimeFull += _solver.multTimeFull->time();
   _statistics->multTimeColwise += _solver.multTimeColwise->time();
   _statistics->multTimeUnsetup += _solver.multTimeUnsetup->time();
   _statistics->multSparseCalls += _solver.multSparseCalls;
   _statistics->multFullCalls += _solver.multFullCalls;
   _statistics->multColwiseCalls += _solver.multColwiseCalls;
   _statistics->multUnsetupCalls += _solver.multUnsetupCalls;
   _statistics->luFactorizationTimeReal += _slufactor.getFactorTime();
   _statistics->luSolveTimeReal += _slufactor.getSolveTime();
   _statistics->luFactorizationsReal += _slufactor.getFactorCount();
   _statistics->luSolvesReal += _slufactor.getSolveCount();
   _slufactor.resetCounters();

   _statistics->degenPivotsPrimal += _solver.primalDegeneratePivots();
   _statistics->degenPivotsDual += _solver.dualDegeneratePivots();
   _statistics->sumDualDegen += _solver.sumDualDegeneracy();
   _statistics->sumPrimalDegen += _solver.sumPrimalDegeneracy();
}